

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O1

int run_test_metrics_pool_events(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  uv_work_t *req;
  uv_work_t *req_00;
  uv_loop_t *unaff_RBX;
  uv_fs_t *puVar3;
  uv_buf_t *unaff_R14;
  int64_t eval_b_9;
  int64_t eval_b_11;
  char rdata;
  uv_metrics_t metrics;
  uv_getaddrinfo_t addrinfo_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_random_t random_req;
  uv_fs_t open_req;
  uv_prepare_t prepare;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  void *pvStackY_bc0;
  uv_loop_t *puStackY_bb8;
  uv_buf_t *puStackY_bb0;
  void *pvStackY_b98;
  uv_metrics_t uStackY_b90;
  uv_loop_t *puStackY_b10;
  undefined1 local_b00 [8];
  uv_loop_t *local_af8;
  undefined1 local_ae9;
  uv_metrics_t local_ae8;
  uv_getaddrinfo_t local_a68;
  uv_buf_t local_9c8;
  uv_fs_t local_9b8;
  uv_fs_t local_7f8;
  uv_random_t local_638;
  uv_fs_t local_5a8;
  uv_prepare_t local_3e8;
  undefined1 local_390 [896];
  
  puStackY_b10 = (uv_loop_t *)0x1a9a12;
  puVar2 = uv_default_loop();
  puStackY_b10 = (uv_loop_t *)0x1a9a21;
  iVar1 = uv_loop_configure(puVar2,UV_METRICS_IDLE_TIME);
  local_5a8.data = (void *)(long)iVar1;
  local_9b8.data = (uv_loop_t *)0x0;
  if (local_5a8.data == (void *)0x0) {
    unaff_RBX = (uv_loop_t *)local_390;
    puStackY_b10 = (uv_loop_t *)0x1a9a68;
    uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)unaff_RBX,"test_file",(uv_fs_cb)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9a70;
    uv_fs_req_cleanup((uv_fs_t *)unaff_RBX);
    puStackY_b10 = (uv_loop_t *)0x1a9a75;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9a85;
    iVar1 = uv_prepare_init(puVar2,&local_3e8);
    local_5a8.data = (void *)(long)iVar1;
    local_9b8.data = (uv_loop_t *)0x0;
    if (local_5a8.data != (void *)0x0) goto LAB_001a9eaa;
    puStackY_b10 = (uv_loop_t *)0x1a9ac5;
    iVar1 = uv_prepare_start(&local_3e8,fs_prepare_cb);
    local_5a8.data = (void *)(long)iVar1;
    local_9b8.data = (uv_loop_t *)0x0;
    if (local_5a8.data != (void *)0x0) goto LAB_001a9ebf;
    pool_events_counter = 0;
    puStackY_b10 = (uv_loop_t *)0x1a9b1f;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&local_5a8,"test_file",0x41,0x180,(uv_fs_cb)0x0);
    local_9b8.data = (void *)(long)iVar1;
    local_7f8.data = (void *)0x0;
    if ((uv_loop_t *)local_9b8.data != (uv_loop_t *)0x0) goto LAB_001a9ed4;
    local_9b8.data = (void *)local_5a8.result;
    local_7f8.data = (void *)0x0;
    unaff_RBX = (uv_loop_t *)local_5a8.result;
    if (local_5a8.result < 0) goto LAB_001a9ee9;
    puStackY_b10 = (uv_loop_t *)0x1a9b8a;
    uv_fs_req_cleanup(&local_5a8);
    puStackY_b10 = (uv_loop_t *)0x1a9b9b;
    local_9c8 = uv_buf_init(test_buf,0xd);
    unaff_R14 = &local_9c8;
    puStackY_b10 = (uv_loop_t *)0x1a9baf;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9bd8;
    iVar1 = uv_fs_write(puVar2,(uv_fs_t *)(local_390 + 0x1c0),(uv_os_fd_t)local_5a8.result,unaff_R14
                        ,1,0,fs_write_cb);
    local_9b8.data = (void *)(long)iVar1;
    local_7f8.data = (void *)0x0;
    if ((uv_loop_t *)local_9b8.data != (uv_loop_t *)0x0) goto LAB_001a9efe;
    puStackY_b10 = (uv_loop_t *)0x1a9c09;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9c27;
    iVar1 = uv_fs_stat(puVar2,&local_9b8,"test_file",fs_stat_cb);
    local_7f8.data = (void *)(long)iVar1;
    local_a68.data = (_func_void_uv__work_ptr *)0x0;
    if (local_7f8.data != (void *)0x0) goto LAB_001a9f13;
    puStackY_b10 = (uv_loop_t *)0x1a9c58;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9c76;
    iVar1 = uv_fs_stat(puVar2,&local_7f8,"test_file",fs_stat_cb);
    local_a68.data = (void *)(long)iVar1;
    local_638.data = (void *)0x0;
    if ((_func_void_uv__work_ptr *)local_a68.data != (_func_void_uv__work_ptr *)0x0)
    goto LAB_001a9f28;
    puStackY_b10 = (uv_loop_t *)0x1a9ca7;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9ccb;
    iVar1 = uv_random(puVar2,&local_638,&local_ae9,1,0,fs_random_cb);
    local_a68.data = (void *)(long)iVar1;
    local_ae8.loop_count = 0;
    if ((_func_void_uv__work_ptr *)local_a68.data != (_func_void_uv__work_ptr *)0x0)
    goto LAB_001a9f3d;
    puStackY_b10 = (uv_loop_t *)0x1a9cf6;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9d1a;
    iVar1 = uv_getaddrinfo(puVar2,&local_a68,fs_addrinfo_cb,"example.invalid",(char *)0x0,
                           (addrinfo *)0x0);
    local_ae8.loop_count = (uint64_t)iVar1;
    local_b00 = (undefined1  [8])0x0;
    if ((uv_close_cb)local_ae8.loop_count != (uv_close_cb)0x0) goto LAB_001a9f4f;
    puStackY_b10 = (uv_loop_t *)0x1a9d44;
    uv_sleep(100);
    puStackY_b10 = (uv_loop_t *)0x1a9d49;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9d53;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_ae8.loop_count = (uint64_t)iVar1;
    local_b00 = (undefined1  [8])0x0;
    if ((uv_close_cb)local_ae8.loop_count != (uv_close_cb)0x0) goto LAB_001a9f5e;
    puStackY_b10 = (uv_loop_t *)0x1a9d78;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9d85;
    iVar1 = uv_metrics_info(puVar2,&local_ae8);
    local_b00 = (undefined1  [8])(long)iVar1;
    local_af8 = (uv_loop_t *)0x0;
    if (local_b00 != (undefined1  [8])0x0) goto LAB_001a9f6d;
    local_b00 = (undefined1  [8])local_ae8.events;
    local_af8 = (uv_loop_t *)0x7;
    if ((long)local_ae8.events < 7) goto LAB_001a9f7c;
    local_b00 = (undefined1  [8])local_ae8.events_waiting;
    local_af8 = (uv_loop_t *)0x4;
    if ((long)local_ae8.events_waiting < 4) goto LAB_001a9f8b;
    local_b00 = (undefined1  [8])(long)pool_events_counter;
    local_af8 = (uv_loop_t *)0xffffffffffffffd6;
    if (local_b00 != (undefined1  [8])0xffffffffffffffd6) goto LAB_001a9f9a;
    puStackY_b10 = (uv_loop_t *)0x1a9e2b;
    uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_390,"test_file",(uv_fs_cb)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9e33;
    uv_fs_req_cleanup((uv_fs_t *)local_390);
    puStackY_b10 = (uv_loop_t *)0x1a9e38;
    unaff_RBX = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9e4c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9e56;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_b00 = (undefined1  [8])0x0;
    puStackY_b10 = (uv_loop_t *)0x1a9e64;
    puVar2 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9e6c;
    iVar1 = uv_loop_close(puVar2);
    local_af8 = (uv_loop_t *)(long)iVar1;
    if (local_b00 == (undefined1  [8])local_af8) {
      puStackY_b10 = (uv_loop_t *)0x1a9e88;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_b10 = (uv_loop_t *)0x1a9eaa;
    run_test_metrics_pool_events_cold_1();
LAB_001a9eaa:
    puStackY_b10 = (uv_loop_t *)0x1a9ebf;
    run_test_metrics_pool_events_cold_2();
LAB_001a9ebf:
    puStackY_b10 = (uv_loop_t *)0x1a9ed4;
    run_test_metrics_pool_events_cold_3();
LAB_001a9ed4:
    puStackY_b10 = (uv_loop_t *)0x1a9ee9;
    run_test_metrics_pool_events_cold_4();
LAB_001a9ee9:
    puStackY_b10 = (uv_loop_t *)0x1a9efe;
    run_test_metrics_pool_events_cold_16();
LAB_001a9efe:
    puStackY_b10 = (uv_loop_t *)0x1a9f13;
    run_test_metrics_pool_events_cold_5();
LAB_001a9f13:
    puStackY_b10 = (uv_loop_t *)0x1a9f28;
    run_test_metrics_pool_events_cold_6();
LAB_001a9f28:
    puStackY_b10 = (uv_loop_t *)0x1a9f3d;
    run_test_metrics_pool_events_cold_7();
LAB_001a9f3d:
    puStackY_b10 = (uv_loop_t *)0x1a9f4f;
    run_test_metrics_pool_events_cold_8();
LAB_001a9f4f:
    puStackY_b10 = (uv_loop_t *)0x1a9f5e;
    run_test_metrics_pool_events_cold_9();
LAB_001a9f5e:
    puStackY_b10 = (uv_loop_t *)0x1a9f6d;
    run_test_metrics_pool_events_cold_10();
LAB_001a9f6d:
    puStackY_b10 = (uv_loop_t *)0x1a9f7c;
    run_test_metrics_pool_events_cold_11();
LAB_001a9f7c:
    puStackY_b10 = (uv_loop_t *)0x1a9f8b;
    run_test_metrics_pool_events_cold_15();
LAB_001a9f8b:
    puStackY_b10 = (uv_loop_t *)0x1a9f9a;
    run_test_metrics_pool_events_cold_14();
LAB_001a9f9a:
    puStackY_b10 = (uv_loop_t *)0x1a9fa9;
    run_test_metrics_pool_events_cold_12();
  }
  puVar2 = (uv_loop_t *)local_b00;
  puStackY_b10 = (uv_loop_t *)fs_prepare_cb;
  run_test_metrics_pool_events_cold_13();
  puStackY_b10 = unaff_RBX;
  loop = uv_default_loop();
  iVar1 = uv_metrics_info(loop,&uStackY_b90);
  pvStackY_b98 = (void *)(long)iVar1;
  if (pvStackY_b98 == (void *)0x0) {
    pvStackY_b98 = (void *)0x0;
    if (pool_events_counter == 1) {
      pvStackY_b98 = (void *)uStackY_b90.events;
      if (uStackY_b90.events != uStackY_b90.events_waiting) goto LAB_001aa045;
    }
    iVar1 = pool_events_counter;
    if (6 < pool_events_counter) {
      iVar1 = uv_prepare_stop((uv_prepare_t *)puVar2);
      pool_events_counter = -0x2a;
    }
    return iVar1;
  }
  fs_prepare_cb_cold_1();
LAB_001aa045:
  puVar3 = (uv_fs_t *)&pvStackY_b98;
  fs_prepare_cb_cold_2();
  puStackY_bb8 = puVar2;
  puStackY_bb0 = unaff_R14;
  req = (uv_work_t *)malloc(0x80);
  req_00 = (uv_work_t *)malloc(0x80);
  pool_events_counter = pool_events_counter + 1;
  uv_fs_req_cleanup(puVar3);
  puVar2 = uv_default_loop();
  iVar1 = uv_queue_work(puVar2,req,fs_work_cb,fs_after_work_cb);
  pvStackY_bc0 = (void *)(long)iVar1;
  if (pvStackY_bc0 == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_queue_work(puVar2,req_00,fs_work_cb,fs_after_work_cb);
    pvStackY_bc0 = (void *)(long)iVar1;
    if (pvStackY_bc0 == (void *)0x0) {
      return iVar1;
    }
  }
  else {
    fs_write_cb_cold_1();
  }
  puVar3 = (uv_fs_t *)&pvStackY_bc0;
  fs_write_cb_cold_2();
  uv_fs_req_cleanup(puVar3);
  pool_events_counter = pool_events_counter + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(metrics_pool_events) {
  uv_buf_t iov;
  uv_fs_t open_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  uv_getaddrinfo_t addrinfo_req;
  uv_metrics_t metrics;
  uv_prepare_t prepare;
  uv_random_t random_req;
  uv_os_fd_t fd;
  int r;
  char rdata;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare));
  ASSERT_OK(uv_prepare_start(&prepare, fs_prepare_cb));

  pool_events_counter = 0;
  r = uv_fs_open(NULL,
                  &open_req, "test_file", UV_FS_O_WRONLY | UV_FS_O_CREAT,
                  S_IRUSR | S_IWUSR,
                  NULL);
  ASSERT_EQ(r, 0);
  ASSERT_GE(open_req.result, 0);
  fd = (uv_os_fd_t) open_req.result;
  uv_fs_req_cleanup(&open_req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &write_req,
                        fd,
                        &iov,
                        1,
                        0,
                        fs_write_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat1_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat2_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_random(uv_default_loop(),
                      &random_req,
                      &rdata,
                      1,
                      0,
                      fs_random_cb));
  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &addrinfo_req,
                           fs_addrinfo_cb,
                           "example.invalid",
                           NULL,
                           NULL));

  /* Sleep for a moment to hopefully force the events to complete before
   * entering the event loop. */
  uv_sleep(100);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* It's possible for uv__work_done() to execute one extra time even though the
   * QUEUE has already been cleared out. This has to do with the way we use an
   * uv_async to tell the event loop thread to process the worker pool QUEUE. */
  ASSERT_GE(metrics.events, 7);
  /* It's possible one of the other events also got stuck in the event queue, so
   * check GE instead of EQ. Reason for 4 instead of 5 is because the call to
   * uv_getaddrinfo() is racey and slow. So can't guarantee that it'll always
   * execute before sleep completes. */
  ASSERT_GE(metrics.events_waiting, 4);
  ASSERT_EQ(pool_events_counter, -42);

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}